

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffmvec(fitsfile *fptr,int colnum,LONGLONG newveclen,int *status)

{
  uint uVar1;
  tcolumn *ptVar2;
  long naxis2;
  LONGLONG naxis1;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  FITSfile *pFVar7;
  long lVar8;
  long ninsert;
  long lVar9;
  long lVar10;
  char tcode [2];
  int tstatus;
  long local_e8;
  long local_e0;
  char tfm [71];
  char keyname [75];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3))
    goto LAB_00128325;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar7 = fptr->Fptr;
  if (pFVar7->hdutype != 2) {
    ffpmsg("Can only change vector length of a column in BINTABLE extension (ffmvec)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((colnum < 1) || (pFVar7->tfield < colnum)) {
    *status = 0x12e;
    return 0x12e;
  }
  ptVar2 = pFVar7->tableptr;
  uVar1 = colnum - 1;
  iVar3 = ptVar2[uVar1].tdatatype;
  if (iVar3 < 0) {
    ffpmsg("Can\'t modify vector length of variable length column (ffmvec)");
    *status = 0x105;
    return 0x105;
  }
  lVar6 = ptVar2[uVar1].trepeat;
  if (newveclen - lVar6 != 0) {
    lVar8 = 1;
    if (iVar3 != 0x10) {
      lVar8 = ptVar2[uVar1].twidth;
    }
    naxis2 = pFVar7->numrows;
    naxis1 = pFVar7->rowlength;
    if (iVar3 == 1) {
      ninsert = (lVar6 + 7) / -8 + (newveclen + 7) / 8;
    }
    else {
      ninsert = (newveclen - lVar6) * lVar8;
    }
    if (ninsert < 1) {
      if (ninsert < 0) {
        lVar6 = ninsert * naxis2;
        lVar10 = (-((pFVar7->heapsize + pFVar7->heapstart + 0xb3f) % 0xb40) - lVar6) + 0xb3f;
        ffcdel(fptr,naxis1,naxis2,-ninsert,lVar8 * newveclen + ptVar2[uVar1].tbcol,status);
        pFVar7 = fptr->Fptr;
        if ((0 < pFVar7->heapsize) &&
           (iVar4 = ffshft(fptr,pFVar7->heapstart + pFVar7->datastart,pFVar7->heapsize,lVar6,status)
           , 0 < iVar4)) goto LAB_00128325;
        if (0xb3f < lVar10) {
          ffdblk(fptr,lVar10 / 0xb40,status);
        }
        lVar6 = lVar6 + fptr->Fptr->heapstart;
        fptr->Fptr->heapstart = lVar6;
        tstatus = 0;
        ffmkyj(fptr,"THEAP",lVar6,"&",&tstatus);
      }
    }
    else {
      lVar10 = pFVar7->heapsize;
      lVar5 = (pFVar7->heapstart + lVar10 + 0xb3f) % 0xb40;
      lVar9 = ninsert * naxis2;
      local_e8 = naxis2;
      local_e0 = lVar8;
      if (0xb3f - lVar5 < lVar9) {
        iVar4 = ffiblk(fptr,(lVar5 + lVar9) / 0xb40,1,status);
        if (0 < iVar4) goto LAB_00128325;
        pFVar7 = fptr->Fptr;
        lVar10 = pFVar7->heapsize;
      }
      if (0 < lVar10) {
        iVar4 = ffshft(fptr,pFVar7->heapstart + pFVar7->datastart,lVar10,lVar9,status);
        if (0 < iVar4) goto LAB_00128325;
        pFVar7 = fptr->Fptr;
      }
      lVar9 = lVar9 + pFVar7->heapstart;
      pFVar7->heapstart = lVar9;
      tstatus = 0;
      ffmkyj(fptr,"THEAP",lVar9,"&",&tstatus);
      ffcins(fptr,naxis1,local_e8,ninsert,local_e0 * lVar6 + fptr->Fptr->tableptr[uVar1].tbcol,
             status);
    }
    if (iVar3 == 1) {
      tcode[0] = 'X';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0xe) {
      tcode[0] = 'L';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0xb) {
      tcode[0] = 'B';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0x10) {
      tcode[0] = 'A';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0xa3) {
      tcode[0] = 'M';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0x29) {
      tcode[0] = 'J';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0x2a) {
      tcode[0] = 'E';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0x51) {
      tcode[0] = 'K';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0x52) {
      tcode[0] = 'D';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0x53) {
      tcode[0] = 'C';
      tcode[1] = '\0';
    }
    else if (iVar3 == 0x15) {
      tcode[0] = 'I';
      tcode[1] = '\0';
    }
    snprintf(tfm,0x47,"%.0f%s",(double)newveclen,tcode);
    ffkeyn("TFORM",colnum,keyname,status);
    ffmkys(fptr,keyname,tfm,"&",status);
    ffmkyj(fptr,"NAXIS1",ninsert + naxis1,"&",status);
    ffrdef(fptr,status);
  }
LAB_00128325:
  return *status;
}

Assistant:

int ffmvec(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colnum,      /* I - position of col to be modified           */
           LONGLONG newveclen,  /* I - new vector length of column (TFORM)       */
           int *status)     /* IO - error status                            */
/*
  Modify the vector length of a column in a binary table, larger or smaller.
  E.g., change a column from TFORMn = '1E' to '20E'.
*/
{
    int datacode, tfields, tstatus;
    LONGLONG datasize, size, firstbyte, nbytes, nadd, ndelete;
    LONGLONG naxis1, naxis2, firstcol, freespace;
    LONGLONG width, delbyte, repeat;
    long nblock;
    char tfm[FLEN_VALUE], keyname[FLEN_KEYWORD], tcode[2];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype != BINARY_TBL)
    {
       ffpmsg(
  "Can only change vector length of a column in BINTABLE extension (ffmvec)");
       return(*status = NOT_TABLE);
    }

    /*  is the column number valid?  */
    tfields = (fptr->Fptr)->tfield;
    if (colnum < 1 || colnum > tfields)
        return(*status = BAD_COL_NUM);

    /* look up the current vector length and element width */

    colptr = (fptr->Fptr)->tableptr;
    colptr += (colnum - 1);

    datacode = colptr->tdatatype; /* datatype of the column */
    repeat =  colptr->trepeat;  /* field repeat count  */
    width =  colptr->twidth;   /*  width of a single element in chars */

    if (datacode < 0)
    {
        ffpmsg(
        "Can't modify vector length of variable length column (ffmvec)");
        return(*status = BAD_TFORM);
    }

    if (repeat == newveclen)
        return(*status);  /* column already has the desired vector length */

    if (datacode == TSTRING)
        width = 1;      /* width was equal to width of unit string */

    naxis1 =  (fptr->Fptr)->rowlength;   /* current width of the table */
    naxis2 = (fptr->Fptr)->numrows;

    delbyte = (newveclen - repeat) * width;    /* no. of bytes to insert */
    if (datacode == TBIT)  /* BIT column is a special case */
       delbyte = ((newveclen + 7) / 8) - ((repeat + 7) / 8);

    if (delbyte > 0)  /* insert space for more elements */
    {
      /* current size of data */
      datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
      freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;

      nadd = (LONGLONG)delbyte * naxis2;   /* no. of bytes to add to table */

      if ( (freespace - nadd) < 0)   /* not enough existing space? */
      {
        nblock = (long) ((nadd - freespace + 2879) / 2880);    /* number of blocks  */
        if (ffiblk(fptr, nblock, 1, status) > 0)      /* insert the blocks */
          return(*status);
      }

      /* shift heap down (if it exists) */
      if ((fptr->Fptr)->heapsize > 0)
      {
        nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift down */

        /* absolute heap pos */
        firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;

        if (ffshft(fptr, firstbyte, nbytes, nadd, status) > 0) /* move heap */
            return(*status);
      }

      /* update the heap starting address */
      (fptr->Fptr)->heapstart += nadd;

      /* update the THEAP keyword if it exists */
      tstatus = 0;
      ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);

      /* Must reset colptr before using it again.  (fptr->Fptr)->tableptr
         may have been reallocated down in ffbinit via the call to ffiblk above.*/
      colptr = (fptr->Fptr)->tableptr;
      colptr += (colnum - 1);

      firstcol = colptr->tbcol + (repeat * width);  /* insert position */

      /* insert delbyte bytes in every row, at byte position firstcol */
      ffcins(fptr, naxis1, naxis2, delbyte, firstcol, status);
    }
    else if (delbyte < 0)
    {
      /* current size of table */
      size = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
      freespace = ((size + 2879) / 2880) * 2880 - size - ((LONGLONG)delbyte * naxis2);
      nblock = (long) (freespace / 2880);   /* number of empty blocks to delete */
      firstcol = colptr->tbcol + (newveclen * width);  /* delete position */

      /* delete elements from the vector */
      ffcdel(fptr, naxis1, naxis2, -delbyte, firstcol, status);
 
      /* abs heap pos */
      firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;
      ndelete = (LONGLONG)delbyte * naxis2; /* size of shift (negative) */

      /* shift heap up (if it exists) */
      if ((fptr->Fptr)->heapsize > 0)
      {
        nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift up */
        if (ffshft(fptr, firstbyte, nbytes, ndelete, status) > 0)
          return(*status);
      }

      /* delete the empty  blocks at the end of the HDU */
      if (nblock > 0)
        ffdblk(fptr, nblock, status);

      /* update the heap starting address */
      (fptr->Fptr)->heapstart += ndelete;  /* ndelete is negative */

      /* update the THEAP keyword if it exists */
      tstatus = 0;
      ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);
    }

    /* construct the new TFORM keyword for the column */
    if (datacode == TBIT)
      strcpy(tcode,"X");
    else if (datacode == TBYTE)
      strcpy(tcode,"B");
    else if (datacode == TLOGICAL)
      strcpy(tcode,"L");
    else if (datacode == TSTRING)
      strcpy(tcode,"A");
    else if (datacode == TSHORT)
      strcpy(tcode,"I");
    else if (datacode == TLONG)
      strcpy(tcode,"J");
    else if (datacode == TLONGLONG)
      strcpy(tcode,"K");
    else if (datacode == TFLOAT)
      strcpy(tcode,"E");
    else if (datacode == TDOUBLE)
      strcpy(tcode,"D");
    else if (datacode == TCOMPLEX)
      strcpy(tcode,"C");
    else if (datacode == TDBLCOMPLEX)
      strcpy(tcode,"M");

    /* write as a double value because the LONGLONG conversion */
    /* character in snprintf is platform dependent ( %lld, %ld, %I64d ) */

    snprintf(tfm,FLEN_VALUE,"%.0f%s",(double) newveclen, tcode); 

    ffkeyn("TFORM", colnum, keyname, status);  /* Keyword name */
    ffmkys(fptr, keyname, tfm, "&", status);   /* modify TFORM keyword */

    ffmkyj(fptr, "NAXIS1", naxis1 + delbyte, "&", status); /* modify NAXIS1 */

    ffrdef(fptr, status); /* reinitialize the new table structure */
    return(*status);
}